

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O2

XSComplexTypeDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,ComplexTypeInfo *typeInfo,XSModel *xsModel)

{
  ComplexTypeInfo *typeInfo_00;
  int iVar1;
  XSComplexTypeDefinition *this_00;
  XSWildcard *xsWildcard;
  XMLAttDefList *pXVar2;
  undefined4 extraout_var;
  XSParticle *xsParticle;
  XSAnnotation *headAnnot;
  SchemaAttDef *attDef;
  XSAttributeDeclaration *xsAttDecl;
  XSAttributeUse *toAdd;
  SchemaElementDecl *elemDecl;
  XMLSize_t j;
  XMLSize_t index;
  XSObjectFactory *this_01;
  BaseRefVectorOf<xercesc_4_0::XSAttributeUse> *this_02;
  uint uVar3;
  XMLSize_t XVar4;
  XSSimpleTypeDefinition *local_68;
  XSSimpleTypeDefinition *local_60;
  BaseRefVectorOf<xercesc_4_0::XSAttributeUse> *local_58;
  ulong local_48;
  undefined4 extraout_var_00;
  
  this_00 = (XSComplexTypeDefinition *)XSModel::getXSObject(xsModel,typeInfo);
  if (this_00 == (XSComplexTypeDefinition *)0x0) {
    if (typeInfo->fAttWildCard == (SchemaAttDef *)0x0) {
      xsWildcard = (XSWildcard *)0x0;
    }
    else {
      xsWildcard = createXSWildcard(this,typeInfo->fAttWildCard,xsModel);
    }
    if ((typeInfo->fContentType == 5) && (typeInfo->fDatatypeValidator != (DatatypeValidator *)0x0))
    {
      local_68 = addOrFind(this,typeInfo->fDatatypeValidator,xsModel,false);
    }
    else {
      local_68 = (XSSimpleTypeDefinition *)0x0;
    }
    if (typeInfo->fAttDefs->fCount == 0) {
      local_48 = 0;
      local_58 = (BaseRefVectorOf<xercesc_4_0::XSAttributeUse> *)0x0;
    }
    else {
      pXVar2 = ComplexTypeInfo::getAttDefList(typeInfo);
      iVar1 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2);
      local_48 = CONCAT44(extraout_var,iVar1);
      local_58 = (BaseRefVectorOf<xercesc_4_0::XSAttributeUse> *)
                 XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::XSAttributeUse>::RefVectorOf
                ((RefVectorOf<xercesc_4_0::XSAttributeUse> *)local_58,local_48,false,
                 this->fMemoryManager);
    }
    typeInfo_00 = typeInfo->fBaseComplexTypeInfo;
    if (typeInfo_00 == typeInfo) {
      local_60 = (XSSimpleTypeDefinition *)0x0;
    }
    else if (typeInfo_00 == (ComplexTypeInfo *)0x0) {
      if (typeInfo->fBaseDatatypeValidator == (DatatypeValidator *)0x0) {
        local_60 = (XSSimpleTypeDefinition *)
                   XSModel::getTypeDefinition
                             (xsModel,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE,
                              (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      }
      else {
        local_60 = addOrFind(this,typeInfo->fBaseDatatypeValidator,xsModel,false);
      }
    }
    else {
      local_60 = (XSSimpleTypeDefinition *)addOrFind(this,typeInfo_00,xsModel);
    }
    if (typeInfo->fContentSpec == (ContentSpecNode *)0x0) {
      xsParticle = (XSParticle *)0x0;
    }
    else {
      xsParticle = createModelGroupParticle(this,typeInfo->fContentSpec,xsModel);
    }
    this_01 = (XSObjectFactory *)0x70;
    this_00 = (XSComplexTypeDefinition *)XMemory::operator_new(0x70,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this_01,xsModel,typeInfo);
    XSComplexTypeDefinition::XSComplexTypeDefinition
              (this_00,typeInfo,xsWildcard,local_68,(XSAttributeUseList *)local_58,
               &local_60->super_XSTypeDefinition,xsParticle,headAnnot,xsModel,this->fMemoryManager);
    putObjectInMap(this,typeInfo,(XSObject *)this_00);
    if (typeInfo_00 == typeInfo) {
      (this_00->super_XSTypeDefinition).fBaseType = (XSTypeDefinition *)this_00;
    }
    if (typeInfo->fAttDefs->fCount != 0) {
      pXVar2 = ComplexTypeInfo::getAttDefList(typeInfo);
      for (uVar3 = 0; uVar3 < local_48; uVar3 = uVar3 + 1) {
        iVar1 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[0xb])(pXVar2,(ulong)uVar3);
        attDef = (SchemaAttDef *)CONCAT44(extraout_var_00,iVar1);
        if (attDef->fBaseAttDecl == (SchemaAttDef *)0x0) {
          xsAttDecl = addOrFind(this,attDef,xsModel,this_00);
        }
        else {
          xsAttDecl = addOrFind(this,attDef->fBaseAttDecl,xsModel,(XSComplexTypeDefinition *)0x0);
          RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::PtrHasher>::put
                    (this->fXercesToXSMap,attDef,&xsAttDecl->super_XSObject);
        }
        if ((attDef->super_XMLAttDef).fDefaultType != DefAttTypes_Max) {
          toAdd = createXSAttributeUse(this,xsAttDecl,xsModel);
          this_02 = local_58;
          BaseRefVectorOf<xercesc_4_0::XSAttributeUse>::addElement(local_58,toAdd);
          processAttUse((XSObjectFactory *)this_02,attDef,toAdd);
        }
      }
    }
    if (typeInfo->fElements == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
      XVar4 = 0;
    }
    else {
      XVar4 = (typeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount
      ;
    }
    for (index = 0; XVar4 != index; index = index + 1) {
      elemDecl = ComplexTypeInfo::elementAt(typeInfo,index);
      if ((elemDecl->fEnclosingScope == typeInfo->fScopeDefined) &&
         (elemDecl->fPSVIScope == SCP_LOCAL)) {
        addOrFind(this,elemDecl,xsModel,this_00);
      }
    }
  }
  return this_00;
}

Assistant:

XSComplexTypeDefinition*
XSObjectFactory::addOrFind(ComplexTypeInfo* const typeInfo,
                           XSModel* const xsModel)
{
    XSComplexTypeDefinition* xsObj = (XSComplexTypeDefinition*) xsModel->getXSObject(typeInfo);
    if (!xsObj)
    {
        XSWildcard*             xsWildcard = 0;
        XSSimpleTypeDefinition* xsSimpleType = 0;
        XSAttributeUseList*     xsAttList = 0;
        XSTypeDefinition*       xsBaseType = 0;
        XSParticle*             xsParticle = 0;

        if (typeInfo->getAttWildCard())
            xsWildcard = createXSWildcard(typeInfo->getAttWildCard(), xsModel);

        if ((typeInfo->getContentType() == SchemaElementDecl::Simple) &&
            (typeInfo->getDatatypeValidator()))
            xsSimpleType = addOrFind(typeInfo->getDatatypeValidator(), xsModel);

        XMLSize_t attCount=0;
        if (typeInfo->hasAttDefs())
        {
            SchemaAttDefList& attDefList = (SchemaAttDefList&) typeInfo->getAttDefList();
            attCount = attDefList.getAttDefCount();
            xsAttList = new (fMemoryManager) RefVectorOf<XSAttributeUse>(attCount, false, fMemoryManager);
            // create list now put fill it in after we put complextype into map
            // otherwise we may encounter an infinite loop: complextype needs to
            // addorfind attdef, which does an addorfind on the enclosingCTdefintion.
        }

        // compute fBase
        bool isAnyType = false;
        if (typeInfo->getBaseComplexTypeInfo() == typeInfo) // case of anyType
            isAnyType = true;
        else if (typeInfo->getBaseComplexTypeInfo())
            xsBaseType = addOrFind(typeInfo->getBaseComplexTypeInfo(), xsModel);
        else if (typeInfo->getBaseDatatypeValidator())
            xsBaseType = addOrFind(typeInfo->getBaseDatatypeValidator(), xsModel);
        else // base is anyType
            xsBaseType = xsModel->getTypeDefinition(SchemaSymbols::fgATTVAL_ANYTYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);

        // compute particle
        ContentSpecNode* contentSpec = typeInfo->getContentSpec();
        if (contentSpec)
            xsParticle = createModelGroupParticle(contentSpec, xsModel);

        xsObj = new (fMemoryManager) XSComplexTypeDefinition
        (
            typeInfo
            , xsWildcard
            , xsSimpleType
            , xsAttList
            , xsBaseType
            , xsParticle
            , getAnnotationFromModel(xsModel, typeInfo)
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(typeInfo, xsObj);

        if (isAnyType)
            xsObj->setBaseType(xsObj);

        if (typeInfo->hasAttDefs())
        {
            // now create the xsattributedeclarations...
            SchemaAttDefList& attDefList = (SchemaAttDefList&) typeInfo->getAttDefList();
            for(unsigned int i=0; i<attCount; i++)
            {
                XSAttributeDeclaration* xsAttDecl = 0;
                SchemaAttDef& attDef = (SchemaAttDef&) attDefList.getAttDef(i);

                if (attDef.getBaseAttDecl())
                {
                    xsAttDecl = addOrFind(attDef.getBaseAttDecl(), xsModel);
                    fXercesToXSMap->put(&attDef, xsAttDecl);
                }
                else
                    xsAttDecl = addOrFind(&attDef, xsModel, xsObj);

                if (attDef.getDefaultType() != XMLAttDef::Prohibited) {

                    XSAttributeUse* attUse = createXSAttributeUse(xsAttDecl, xsModel);
                    xsAttList->addElement(attUse);
                    processAttUse(&attDef, attUse);
                }
            }
        }

        // process local elements
        XMLSize_t elemCount = typeInfo->elementCount();
        for (XMLSize_t j=0; j<elemCount; j++)
        {
            SchemaElementDecl* elemDecl = typeInfo->elementAt(j);

            if (elemDecl->getEnclosingScope() == typeInfo->getScopeDefined()
                && elemDecl->getPSVIScope() == PSVIDefs::SCP_LOCAL)
                addOrFind(elemDecl, xsModel, xsObj);
        }
    }

    return xsObj;
}